

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_object(parser *p)

{
  ushort uVar1;
  undefined2 uVar2;
  void *pvVar3;
  angband_constants *paVar4;
  void *pvVar5;
  ulong uVar6;
  uint16_t uVar7;
  object_kind *poVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  z_info->k_max = 0;
  pvVar5 = parser_priv(p);
  paVar4 = z_info;
  uVar7 = z_info->k_max;
  for (; pvVar5 != (void *)0x0; pvVar5 = *(void **)((long)pvVar5 + 0x18)) {
    uVar7 = uVar7 + 1;
    paVar4->k_max = uVar7;
  }
  k_info = (object_kind *)mem_zalloc((ulong)uVar7 * 0x2c0 + 0x2c0);
  uVar1 = z_info->k_max;
  pvVar5 = parser_priv(p);
  lVar11 = (ulong)uVar1 * 0x2c0;
  uVar10 = (ulong)uVar1;
  while( true ) {
    paVar4 = z_info;
    uVar9 = uVar10 - 1;
    if (pvVar5 == (void *)0x0) {
      uVar2 = z_info->k_max;
      z_info->k_max = uVar2 + 1;
      paVar4->ordinary_kind_max = uVar2 + 1;
      parser_destroy(p);
      return 0;
    }
    if (uVar9 == 0xffffffffffffffff) break;
    uVar6 = uVar9 & 0xffffffff;
    memcpy(k_info + uVar6,pvVar5,0x2c0);
    poVar8 = k_info + uVar6;
    k_info[uVar6].kidx = (uint32_t)uVar9;
    flag_union(poVar8->kind_flags,kb_info[*(int *)((long)pvVar5 + 0x24)].kind_flags,4);
    pvVar3 = *(void **)((long)pvVar5 + 0x18);
    poVar8 = (object_kind *)(k_info->flags + lVar11 + -0x80);
    if (z_info->k_max <= uVar10) {
      poVar8 = (object_kind *)0x0;
    }
    k_info[uVar6].next = poVar8;
    mem_free(pvVar5);
    lVar11 = lVar11 + -0x2c0;
    pvVar5 = pvVar3;
    uVar10 = uVar9;
  }
  __assert_fail("kidx >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                ,0x8b7,"errr finish_parse_object(struct parser *)");
}

Assistant:

static errr finish_parse_object(struct parser *p) {
	struct object_kind *k, *next = NULL;
	int kidx;

	/* scan the list for the max id */
	z_info->k_max = 0;
	k = parser_priv(p);
	while (k) {
		z_info->k_max++;
		k = k->next;
	}

	/* allocate the direct access list and copy the data to it */
	k_info = mem_zalloc((z_info->k_max + 1) * sizeof(*k));
	kidx = z_info->k_max - 1;
	for (k = parser_priv(p); k; k = next, kidx--) {
		assert(kidx >= 0);

		memcpy(&k_info[kidx], k, sizeof(*k));
		k_info[kidx].kidx = kidx;

		/* Add base kind flags to kind kind flags */
		kf_union(k_info[kidx].kind_flags, kb_info[k->tval].kind_flags);

		next = k->next;
		if (kidx < z_info->k_max - 1) {
			k_info[kidx].next = &k_info[kidx + 1];
		} else {
			k_info[kidx].next = NULL;
		}
		mem_free(k);
	}
	z_info->k_max += 1;
	z_info->ordinary_kind_max = z_info->k_max;

	parser_destroy(p);
	return 0;
}